

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SimplePathIntegrator::Li
          (SimplePathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *param_5)

{
  PrimitiveHandle *this_00;
  Vector3f *pVVar1;
  undefined8 uVar2;
  size_t sVar3;
  pointer pLVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  short sVar9;
  Vector3f wiRender;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector3f wiRender_00;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  BxDFFlags BVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  DebugMLTSampler *pDVar27;
  uintptr_t uVar28;
  ImageInfiniteLight *this_01;
  DiffuseBxDF *pDVar29;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *pLVar30;
  LightHandle *light;
  pointer pLVar31;
  long in_FS_OFFSET;
  bool bVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  Float FVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  Tuple2<pbrt::Point2,_float> u2;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar84 [56];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar61 [64];
  undefined1 auVar63 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar82 [64];
  undefined4 uVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar97 [56];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  float fVar98;
  undefined1 in_ZMM6 [64];
  Vector3f w;
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f woRender_01;
  SampledSpectrum SVar99;
  SampledSpectrum SVar100;
  SampledSpectrum b;
  undefined1 local_368 [8];
  undefined4 uStack_360;
  undefined4 uStack_35c;
  DispatchSplit<9> local_349;
  SampledSpectrum f;
  Vector3f local_338 [2];
  undefined1 local_320 [8];
  undefined1 local_318 [16];
  SampledSpectrum beta;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  ulong uStack_2c0;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_298;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_290;
  optional<pbrt::LightLiSample> ls;
  uintptr_t local_200;
  anon_struct_8_0_00000001_for___align local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar49 [64];
  undefined1 auVar62 [64];
  undefined1 auVar83 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_19 [56];
  undefined1 extraout_var_20 [56];
  undefined1 extraout_var_21 [56];
  undefined1 extraout_var_22 [56];
  undefined1 extraout_var_23 [56];
  undefined1 extraout_var_24 [56];
  undefined1 extraout_var_25 [56];
  undefined1 extraout_var_26 [56];
  undefined1 auVar90 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  
  beta.values.values[0] = 1.0;
  beta.values.values[1] = 1.0;
  beta.values.values[2] = 1.0;
  beta.values.values[3] = 1.0;
  this_00 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  _local_2e8 = ZEXT816(0);
  local_368._0_4_ = 1;
  iVar22 = 0;
  do {
    if ((beta.values.values[0] == 0.0) && (!NAN(beta.values.values[0]))) {
      uVar23 = 0;
      while (uVar25 = uVar23, uVar25 != 3) {
        fVar41 = beta.values.values[uVar25 + 1];
        if ((fVar41 != 0.0) || (uVar23 = uVar25 + 1, NAN(fVar41))) break;
      }
      if (2 < uVar25) break;
    }
    *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
    if (((this_00->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      si.optionalValue._0_64_ = ZEXT464(0) << 0x20;
      si.set = false;
      si._257_7_ = 0;
      si.optionalValue._64_64_ = si.optionalValue._0_64_;
      si.optionalValue._128_64_ = si.optionalValue._0_64_;
      si.optionalValue._192_64_ = si.optionalValue._0_64_;
    }
    else {
      in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
      PrimitiveHandle::Intersect(&si,this_00,&ray->super_Ray,INFINITY);
    }
    if (si.set == false) {
      if ((this->sampleLights != true) ||
         (bVar33 = true, (_local_368 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        pLVar4 = *(pointer *)
                  ((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                          infiniteLights.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data + 8);
        bVar33 = true;
        for (pLVar31 = (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                       infiniteLights.
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start; pLVar31 != pLVar4;
            pLVar31 = pLVar31 + 1) {
          uVar23 = (pLVar31->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          auVar34 = ZEXT816(0) << 0x40;
          auVar35 = ZEXT816(0) << 0x40;
          if (0x6ffffffffffff < uVar23) {
            this_01 = (ImageInfiniteLight *)(uVar23 & 0xffffffffffff);
            auVar34 = in_ZMM6._0_16_;
            if (uVar23 >> 0x30 == 8) {
              auVar84 = ZEXT856(0);
              auVar97 = ZEXT856(0);
              in_ZMM6 = ZEXT1664(auVar34);
              SVar99 = ImageInfiniteLight::Le(this_01,&ray->super_Ray,lambda);
              auVar92._0_8_ = SVar99.values.values._8_8_;
              auVar92._8_56_ = auVar97;
              auVar35 = auVar92._0_16_;
              auVar51._0_8_ = SVar99.values.values._0_8_;
              auVar51._8_56_ = auVar84;
              auVar34 = auVar51._0_16_;
            }
            else if ((short)(uVar23 >> 0x30) == 7) {
              auVar84 = ZEXT856(0);
              auVar97 = ZEXT856(0);
              in_ZMM6 = ZEXT1664(auVar34);
              SVar99 = UniformInfiniteLight::Le
                                 ((UniformInfiniteLight *)this_01,&ray->super_Ray,lambda);
              auVar91._0_8_ = SVar99.values.values._8_8_;
              auVar91._8_56_ = auVar97;
              auVar35 = auVar91._0_16_;
              auVar50._0_8_ = SVar99.values.values._0_8_;
              auVar50._8_56_ = auVar84;
              auVar34 = auVar50._0_16_;
            }
            else {
              auVar84 = ZEXT856(0);
              auVar97 = ZEXT856(0);
              in_ZMM6 = ZEXT1664(auVar34);
              SVar99 = PortalImageInfiniteLight::Le
                                 ((PortalImageInfiniteLight *)this_01,&ray->super_Ray,lambda);
              auVar93._0_8_ = SVar99.values.values._8_8_;
              auVar93._8_56_ = auVar97;
              auVar35 = auVar93._0_16_;
              auVar52._0_8_ = SVar99.values.values._0_8_;
              auVar52._8_56_ = auVar84;
              auVar34 = auVar52._0_16_;
            }
          }
          auVar34 = vmovlhps_avx(auVar34,auVar35);
          auVar35._0_4_ = auVar34._0_4_ * beta.values.values[0];
          auVar35._4_4_ = auVar34._4_4_ * beta.values.values[1];
          auVar35._8_4_ = auVar34._8_4_ * beta.values.values[2];
          auVar35._12_4_ = auVar34._12_4_ * beta.values.values[3];
          auVar34 = *(undefined1 (*) [16])(lambda->pdf).values;
          uVar23 = vcmpps_avx512vl(auVar34,_DAT_00565010,4);
          auVar34 = vdivps_avx512vl(auVar35,auVar34);
          local_2e8._0_4_ =
               (float)((uint)((byte)uVar23 & 1) * auVar34._0_4_) + (float)local_2e8._0_4_;
          local_2e8._4_4_ =
               (float)((uint)((byte)(uVar23 >> 1) & 1) * auVar34._4_4_) + (float)local_2e8._4_4_;
          fStack_2e0 = (float)((uint)((byte)(uVar23 >> 2) & 1) * auVar34._8_4_) + fStack_2e0;
          fStack_2dc = (float)((uint)((byte)(uVar23 >> 3) & 1) * auVar34._12_4_) + fStack_2dc;
        }
      }
    }
    else {
      if ((this->sampleLights != true) ||
         ((_local_368 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        auVar36._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar36._4_4_ = 0x80000000;
        auVar36._8_4_ = 0x80000000;
        auVar36._12_4_ = 0x80000000;
        uVar23._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        uVar23._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar34._0_8_ = uVar23 ^ 0x8000000080000000;
        auVar34._8_4_ = 0x80000000;
        auVar34._12_4_ = 0x80000000;
        in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
        w.super_Tuple3<pbrt::Vector3,_float>.z = auVar36._0_4_;
        w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar34._0_8_;
        w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar34._0_8_ >> 0x20);
        auVar97 = ZEXT856(auVar36._8_8_);
        auVar84 = ZEXT856(auVar34._8_8_);
        SVar99 = SurfaceInteraction::Le((SurfaceInteraction *)&si,w,lambda);
        auVar90._0_8_ = SVar99.values.values._8_8_;
        auVar90._8_56_ = auVar97;
        auVar49._0_8_ = SVar99.values.values._0_8_;
        auVar49._8_56_ = auVar84;
        auVar34 = vmovlhps_avx(auVar49._0_16_,auVar90._0_16_);
        auVar42._0_4_ = auVar34._0_4_ * beta.values.values[0];
        auVar42._4_4_ = auVar34._4_4_ * beta.values.values[1];
        auVar42._8_4_ = auVar34._8_4_ * beta.values.values[2];
        auVar42._12_4_ = auVar34._12_4_ * beta.values.values[3];
        auVar34 = *(undefined1 (*) [16])(lambda->pdf).values;
        uVar23 = vcmpps_avx512vl(auVar34,_DAT_00565010,4);
        auVar34 = vdivps_avx512vl(auVar42,auVar34);
        local_2e8._0_4_ = (float)((uint)((byte)uVar23 & 1) * auVar34._0_4_) + (float)local_2e8._0_4_
        ;
        local_2e8._4_4_ =
             (float)((uint)((byte)(uVar23 >> 1) & 1) * auVar34._4_4_) + (float)local_2e8._4_4_;
        fStack_2e0 = (float)((uint)((byte)(uVar23 >> 2) & 1) * auVar34._8_4_) + fStack_2e0;
        fStack_2dc = (float)((uint)((byte)(uVar23 >> 3) & 1) * auVar34._12_4_) + fStack_2dc;
      }
      iVar20 = iVar22 + 1;
      bVar33 = true;
      bVar32 = iVar22 != this->maxDepth;
      iVar22 = iVar20;
      if (bVar32) {
        local_290.bits =
             (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_298.bits =
             (sampler->
             super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
        in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
        SurfaceInteraction::GetBSDF
                  (&bsdf,(SurfaceInteraction *)&si,ray,lambda,(CameraHandle *)&local_290,
                   scratchBuffer,(SamplerHandle *)&local_298);
        if (((ulong)bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                    .bits & 0xffffffffffff) == 0) {
          if (si.set == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
          }
          iVar20 = 2;
          SurfaceInteraction::SkipIntersection
                    ((SurfaceInteraction *)&si,ray,(Float)si.optionalValue._248_4_);
        }
        else {
          pVVar1 = &(ray->super_Ray).d;
          uVar19._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
          uVar19._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
          uVar18._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
          uVar18._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
          uVar17._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
          uVar17._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
          uVar16._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
          uVar16._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
          uVar25._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
          uVar25._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
          auVar43._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar43._4_4_ = 0x80000000;
          auVar43._8_4_ = 0x80000000;
          auVar43._12_4_ = 0x80000000;
          uStack_2c0 = auVar43._8_8_;
          if (this->sampleLights == true) {
            ls.optionalValue.__align =
                 (anon_struct_8_0_00000001_for___align)
                 (sampler->
                 super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            FVar37 = DispatchSplit<9>::operator()
                               ((DispatchSplit<9> *)&f,&ls,(ulong)ls.optionalValue.__align >> 0x30);
            auVar34 = in_ZMM6._0_16_;
            sVar3 = (this->lightSampler).lights.nStored;
            if (sVar3 == 0) {
              auVar14._12_4_ = 0;
              auVar14._0_12_ = local_2f8._4_12_;
              local_2f8 = auVar14 << 0x20;
              uVar28 = 0;
            }
            else {
              auVar35 = vcvtusi2ss_avx512f(auVar34,sVar3);
              iVar20 = (int)(FVar37 * auVar35._0_4_);
              iVar26 = (int)sVar3 + -1;
              if (iVar26 < iVar20) {
                iVar20 = iVar26;
              }
              uVar28 = (this->lightSampler).lights.ptr[iVar20].
                       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                       .bits;
              local_2f8._0_4_ = 1.0 / auVar35._0_4_;
            }
            if (sVar3 != 0) {
              uVar23 = (sampler->
                       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
              pDVar27 = (DebugMLTSampler *)(uVar23 & 0xffffffffffff);
              sVar9 = (short)(uVar23 >> 0x30);
              if (uVar23 < 0x5000000000000) {
                if (uVar23 < 0x3000000000000) {
                  if (sVar9 == 2) {
                    auVar53._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar27);
                    auVar53._8_56_ = extraout_var_03;
                    auVar35 = auVar53._0_16_;
                  }
                  else {
                    auVar57._0_8_ = RandomSampler::Get2D((RandomSampler *)pDVar27);
                    auVar57._8_56_ = extraout_var_07;
                    auVar35 = auVar57._0_16_;
                  }
                }
                else if (sVar9 == 3) {
                  auVar55._0_8_ = HaltonSampler::Get2D((HaltonSampler *)pDVar27);
                  auVar55._8_56_ = extraout_var_05;
                  auVar35 = auVar55._0_16_;
                }
                else {
                  auVar59._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar27);
                  auVar59._8_56_ = extraout_var_09;
                  auVar35 = auVar59._0_16_;
                }
              }
              else if (uVar23 < 0x7000000000000) {
                if (sVar9 == 6) {
                  auVar54._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)pDVar27);
                  auVar54._8_56_ = extraout_var_04;
                  auVar35 = auVar54._0_16_;
                }
                else {
                  auVar58._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar27);
                  auVar58._8_56_ = extraout_var_08;
                  auVar35 = auVar58._0_16_;
                }
              }
              else if (uVar23 >> 0x30 == 8) {
                auVar60._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar27);
                auVar60._8_56_ = extraout_var_10;
                auVar35 = auVar60._0_16_;
              }
              else if (sVar9 == 7) {
                auVar56._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar27);
                auVar56._8_56_ = extraout_var_06;
                auVar35 = auVar56._0_16_;
              }
              else {
                local_318._0_4_ = DebugMLTSampler::Get1D(pDVar27);
                local_318._4_4_ = extraout_XMM0_Db;
                local_318._8_4_ = extraout_XMM0_Dc;
                local_318._12_4_ = extraout_XMM0_Dd;
                auVar61._0_4_ = DebugMLTSampler::Get1D(pDVar27);
                auVar61._4_60_ = extraout_var;
                auVar35 = vinsertps_avx(local_318,auVar61._0_16_,0x10);
              }
              auVar51 = si.optionalValue._0_64_;
              local_1e8 = si.optionalValue._16_8_;
              local_1f8 = si.optionalValue.__align;
              uStack_1f0 = si.optionalValue._8_8_;
              uStack_1d8 = si.optionalValue._48_4_;
              local_1e0 = si.optionalValue._40_8_;
              uStack_1cc = si.optionalValue._136_4_;
              uStack_1d4 = si.optionalValue._128_4_;
              uStack_1d0 = si.optionalValue._132_4_;
              local_338[1].super_Tuple3<pbrt::Vector3,_float>._4_8_ =
                   CONCAT44(uStack_1d4,si.optionalValue._48_4_);
              local_320 = si.optionalValue._132_8_;
              f.values.values[0] = si.optionalValue._0_4_;
              f.values.values[1] = si.optionalValue._4_4_;
              f.values.values[2] = si.optionalValue._8_4_;
              f.values.values[3] = si.optionalValue._12_4_;
              local_338[0].super_Tuple3<pbrt::Vector3,_float>.x = (float)si.optionalValue._16_4_;
              local_338[0].super_Tuple3<pbrt::Vector3,_float>.y = (float)si.optionalValue._20_4_;
              local_338[0].super_Tuple3<pbrt::Vector3,_float>.z = (float)si.optionalValue._40_4_;
              local_338[1].super_Tuple3<pbrt::Vector3,_float>.x = (float)si.optionalValue._44_4_;
              vmovlps_avx(auVar35);
              in_ZMM6 = ZEXT1664(auVar34);
              local_200 = uVar28;
              si.optionalValue._0_64_ = auVar51;
              DispatchSplit<9>::operator()(&ls,&local_349,&local_200);
              uVar85 = ls.optionalValue._24_4_;
              if (ls.set == true) {
                if (((float)ls.optionalValue._0_4_ == 0.0) && (!NAN((float)ls.optionalValue._0_4_)))
                {
                  uVar23 = 0;
                  while (uVar24 = uVar23, uVar24 != 3) {
                    fVar41 = *(float *)((long)&ls.optionalValue + uVar24 * 4 + 4);
                    if ((fVar41 != 0.0) || (uVar23 = uVar24 + 1, NAN(fVar41))) break;
                  }
                  if (2 < uVar24) goto LAB_003f0ccd;
                }
                if (0.0 < (float)ls.optionalValue._28_4_) {
                  local_318._4_4_ = ls.optionalValue._20_4_;
                  local_318._0_4_ = ls.optionalValue._16_4_;
                  wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)ls.optionalValue._20_4_;
                  wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)ls.optionalValue._16_4_;
                  wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)ls.optionalValue._24_4_;
                  local_318._8_8_ = 0;
                  woRender.super_Tuple3<pbrt::Vector3,_float>.z = auVar43._0_4_;
                  woRender.super_Tuple3<pbrt::Vector3,_float>.x =
                       (float)(int)(uVar25 ^ 0x8000000080000000);
                  woRender.super_Tuple3<pbrt::Vector3,_float>.y =
                       (float)(int)((uVar25 ^ 0x8000000080000000) >> 0x20);
                  auVar97 = ZEXT856(uStack_2c0);
                  auVar84 = ZEXT856(0x8000000080000000);
                  SVar99 = BSDF::f(&bsdf,woRender,wiRender_00,Radiance);
                  auVar94._0_8_ = SVar99.values.values._8_8_;
                  auVar94._8_56_ = auVar97;
                  auVar62._0_8_ = SVar99.values.values._0_8_;
                  auVar62._8_56_ = auVar84;
                  auVar34 = vmovlhps_avx(auVar62._0_16_,auVar94._0_16_);
                  auVar35 = vmovshdup_avx(local_318);
                  auVar42 = ZEXT416((uint)((float)uVar85 * (float)si.optionalValue._136_4_));
                  auVar35 = vfmadd132ss_fma(auVar35,auVar42,ZEXT416((uint)si.optionalValue._132_4_))
                  ;
                  auVar42 = vfmsub213ss_fma(ZEXT416((uint)uVar85),
                                            ZEXT416((uint)si.optionalValue._136_4_),auVar42);
                  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ + auVar42._0_4_)),local_318
                                            ,ZEXT416((uint)si.optionalValue._128_4_));
                  auVar86._0_4_ = auVar35._0_4_;
                  auVar86._4_4_ = auVar86._0_4_;
                  auVar86._8_4_ = auVar86._0_4_;
                  auVar86._12_4_ = auVar86._0_4_;
                  auVar8._8_4_ = 0x7fffffff;
                  auVar8._0_8_ = 0x7fffffff7fffffff;
                  auVar8._12_4_ = 0x7fffffff;
                  auVar35 = vandps_avx512vl(auVar86,auVar8);
                  f.values.values[0] = auVar35._0_4_ * auVar34._0_4_;
                  f.values.values[1] = auVar35._4_4_ * auVar34._4_4_;
                  f.values.values[2] = auVar35._8_4_ * auVar34._8_4_;
                  f.values.values[3] = auVar35._12_4_ * auVar34._12_4_;
                  if ((f.values.values[0] == 0.0) && (!NAN(f.values.values[0]))) {
                    uVar23 = 0;
                    while (uVar25 = uVar23, uVar25 != 3) {
                      fVar41 = f.values.values[uVar25 + 1];
                      if ((fVar41 != 0.0) || (uVar23 = uVar25 + 1, NAN(fVar41))) break;
                    }
                    if (2 < uVar25) goto LAB_003f0ccd;
                  }
                  if (ls.set == false) {
                    LogFatal<char_const(&)[4]>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                               ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
                  }
                  bVar33 = Integrator::Unoccluded
                                     ((Integrator *)this,(Interaction *)&si,
                                      (Interaction *)((long)&ls.optionalValue + 0x20));
                  if (bVar33) {
                    if (ls.set == false) {
                      LogFatal<char_const(&)[4]>
                                (Fatal,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                 ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
                    }
                    fVar38 = f.values.values[0] * beta.values.values[0] *
                             (float)ls.optionalValue._0_4_;
                    fVar40 = f.values.values[1] * beta.values.values[1] *
                             (float)ls.optionalValue._4_4_;
                    auVar42 = CONCAT412(f.values.values[3] * beta.values.values[3] *
                                        (float)ls.optionalValue._12_4_,
                                        CONCAT48(f.values.values[2] * beta.values.values[2] *
                                                 (float)ls.optionalValue._8_4_,
                                                 CONCAT44(fVar40,fVar38)));
                    fVar41 = (float)local_2f8._0_4_ * (float)ls.optionalValue._28_4_;
                    fVar39 = fVar41 * (lambda->pdf).values[0];
                    fVar98 = fVar41 * (lambda->pdf).values[1];
                    auVar34 = CONCAT412(fVar41 * (lambda->pdf).values[3],
                                        CONCAT48(fVar41 * (lambda->pdf).values[2],
                                                 CONCAT44(fVar98,fVar39)));
                    auVar34 = vshufpd_avx(auVar34,auVar34,1);
                    auVar35 = vshufpd_avx(auVar42,auVar42,1);
                    SVar99.values.values._8_8_ = auVar35._0_8_;
                    SVar99.values.values[0] = fVar38;
                    SVar99.values.values[1] = fVar40;
                    auVar97 = ZEXT856(auVar35._8_8_);
                    auVar84 = ZEXT856(auVar42._8_8_);
                    b.values.values._8_8_ = auVar34._0_8_;
                    b.values.values[0] = fVar39;
                    b.values.values[1] = fVar98;
                    SVar99 = SafeDiv(SVar99,b);
                    auVar95._0_8_ = SVar99.values.values._8_8_;
                    auVar95._8_56_ = auVar97;
                    auVar63._0_8_ = SVar99.values.values._0_8_;
                    auVar63._8_56_ = auVar84;
                    auVar34 = vunpcklpd_avx(auVar63._0_16_,auVar95._0_16_);
                    local_2e8._4_4_ = auVar34._4_4_ + (float)local_2e8._4_4_;
                    local_2e8._0_4_ = auVar34._0_4_ + (float)local_2e8._0_4_;
                    fStack_2e0 = auVar34._8_4_ + fStack_2e0;
                    fStack_2dc = auVar34._12_4_ + fStack_2dc;
                  }
                }
              }
LAB_003f0ccd:
              if (ls.set == true) {
                ls.set = false;
              }
            }
          }
          auVar34 = in_ZMM6._0_16_;
          if (this->sampleBSDF == true) {
            ls.optionalValue.__align =
                 (anon_struct_8_0_00000001_for___align)
                 (sampler->
                 super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            FVar37 = DispatchSplit<9>::operator()
                               ((DispatchSplit<9> *)&f,&ls,(ulong)ls.optionalValue.__align >> 0x30);
            local_2f8._0_4_ = FVar37;
            uVar23 = (sampler->
                     super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     ).bits;
            pDVar27 = (DebugMLTSampler *)(uVar23 & 0xffffffffffff);
            sVar9 = (short)(uVar23 >> 0x30);
            if (uVar23 < 0x5000000000000) {
              if (uVar23 < 0x3000000000000) {
                if (sVar9 == 2) {
                  u2 = (Tuple2<pbrt::Point2,_float>)
                       StratifiedSampler::Get2D((StratifiedSampler *)pDVar27);
                }
                else {
                  u2 = (Tuple2<pbrt::Point2,_float>)RandomSampler::Get2D((RandomSampler *)pDVar27);
                }
              }
              else if (sVar9 == 3) {
                u2 = (Tuple2<pbrt::Point2,_float>)HaltonSampler::Get2D((HaltonSampler *)pDVar27);
              }
              else {
                u2 = (Tuple2<pbrt::Point2,_float>)
                     PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar27);
              }
            }
            else if (uVar23 < 0x7000000000000) {
              if (sVar9 == 6) {
                u2 = (Tuple2<pbrt::Point2,_float>)ZSobolSampler::Get2D((ZSobolSampler *)pDVar27);
              }
              else {
                u2 = (Tuple2<pbrt::Point2,_float>)SobolSampler::Get2D((SobolSampler *)pDVar27);
              }
            }
            else if (uVar23 >> 0x30 == 8) {
              u2 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar27);
            }
            else if (sVar9 == 7) {
              u2 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar27);
            }
            else {
              local_318._0_4_ = DebugMLTSampler::Get1D(pDVar27);
              local_318._4_4_ = extraout_XMM0_Db_00;
              local_318._8_4_ = extraout_XMM0_Dc_00;
              local_318._12_4_ = extraout_XMM0_Dd_00;
              auVar64._0_4_ = DebugMLTSampler::Get1D(pDVar27);
              auVar64._4_60_ = extraout_var_00;
              auVar34 = vinsertps_avx(local_318,auVar64._0_16_,0x10);
              u2 = auVar34._0_8_;
            }
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = auVar43._0_4_;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.x =
                 (float)(int)(uVar16 ^ 0x8000000080000000);
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
                 (float)(int)((uVar16 ^ 0x8000000080000000) >> 0x20);
            BSDF::Sample_f((optional<pbrt::BSDFSample> *)&f,&bsdf,woRender_00,FVar37,(Point2f)u2,
                           Radiance,All);
            uVar2 = local_338[1].super_Tuple3<pbrt::Vector3,_float>._4_8_;
            bVar33 = (bool)local_320[4];
            iVar20 = 3;
            if ((bool)local_320[4] != false) {
              auVar34 = vfmadd132ss_fma(ZEXT416((uint)si.optionalValue._132_4_),
                                        ZEXT416((uint)((float)si.optionalValue._136_4_ *
                                                      local_338[0].
                                                      super_Tuple3<pbrt::Vector3,_float>.z)),
                                        ZEXT416((uint)local_338[0].
                                                      super_Tuple3<pbrt::Vector3,_float>.y));
              auVar35 = vfmsub213ss_fma(ZEXT416((uint)local_338[0].
                                                      super_Tuple3<pbrt::Vector3,_float>.z),
                                        ZEXT416((uint)si.optionalValue._136_4_),
                                        ZEXT416((uint)((float)si.optionalValue._136_4_ *
                                                      local_338[0].
                                                      super_Tuple3<pbrt::Vector3,_float>.z)));
              auVar34 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ + auVar35._0_4_)),
                                        ZEXT416((uint)si.optionalValue._128_4_),
                                        ZEXT416((uint)local_338[0].
                                                      super_Tuple3<pbrt::Vector3,_float>.x));
              uVar85 = auVar34._0_4_;
              auVar44._4_4_ = uVar85;
              auVar44._0_4_ = uVar85;
              auVar44._8_4_ = uVar85;
              auVar44._12_4_ = uVar85;
              auVar5._8_4_ = 0x7fffffff;
              auVar5._0_8_ = 0x7fffffff7fffffff;
              auVar5._12_4_ = 0x7fffffff;
              auVar34 = vandps_avx512vl(auVar44,auVar5);
              auVar45._0_4_ = auVar34._0_4_ * f.values.values[0];
              auVar45._4_4_ = auVar34._4_4_ * f.values.values[1];
              auVar45._8_4_ = auVar34._8_4_ * f.values.values[2];
              auVar45._12_4_ = auVar34._12_4_ * f.values.values[3];
              auVar6._4_4_ = local_338[1].super_Tuple3<pbrt::Vector3,_float>.x;
              auVar6._0_4_ = local_338[1].super_Tuple3<pbrt::Vector3,_float>.x;
              auVar6._8_4_ = local_338[1].super_Tuple3<pbrt::Vector3,_float>.x;
              auVar6._12_4_ = local_338[1].super_Tuple3<pbrt::Vector3,_float>.x;
              auVar34 = vdivps_avx512vl(auVar45,auVar6);
              beta.values.values[0] = auVar34._0_4_ * beta.values.values[0];
              beta.values.values[1] = auVar34._4_4_ * beta.values.values[1];
              beta.values.values[2] = auVar34._8_4_ * beta.values.values[2];
              beta.values.values[3] = auVar34._12_4_ * beta.values.values[3];
              Interaction::SpawnRay((RayDifferential *)&ls,(Interaction *)&si,local_338);
              local_368._1_3_ = 0;
              local_368[0] = (byte)uVar2 >> 4;
              (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
                   (float)ls.optionalValue._12_4_;
              (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
                   (float)ls.optionalValue._16_4_;
              *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                   CONCAT44(ls.optionalValue._24_4_,ls.optionalValue._20_4_);
              *(anon_struct_8_0_00000001_for___align *)
               &(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float> = ls.optionalValue.__align;
              *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                   CONCAT44(ls.optionalValue._12_4_,ls.optionalValue._8_4_);
              (ray->super_Ray).medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = ls.optionalValue._32_8_;
              auVar12._4_8_ = ls.optionalValue._64_8_;
              auVar12._0_4_ = ls.optionalValue._60_4_;
              auVar12._12_20_ = ls.optionalValue._72_20_;
              *(undefined1 (*) [32])&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = auVar12;
              ray->hasDifferentials = (bool)ls.optionalValue._40_1_;
              *(undefined3 *)&ray->field_0x29 = ls.optionalValue._41_3_;
              (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)ls.optionalValue._44_4_;
              (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)ls.optionalValue._48_4_;
              (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = (float)ls.optionalValue._52_4_;
              (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)ls.optionalValue._56_4_;
              (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)ls.optionalValue._60_4_;
              *(undefined8 *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
                   ls.optionalValue._64_8_;
              iVar20 = 0;
            }
            auVar34 = in_ZMM6._0_16_;
            if ((bool)local_320[4] == true) {
              local_320[4] = 0;
            }
            if (bVar33 == false) goto LAB_003f1ae3;
          }
          else {
            f.values.values[0] = 0.0;
            f.values.values[1] = 0.0;
            f.values.values[2] = 0.0;
            sVar9 = bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                    .bits._6_2_;
            if ((ulong)bsdf.bxdf.
                       super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                       .bits < 0x6000000000000) {
              if ((ulong)bsdf.bxdf.
                         super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                         .bits < 0x3000000000000) {
                pDVar29 = (DiffuseBxDF *)
                          ((ulong)bsdf.bxdf.
                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                  .bits & 0xffffffffffff);
                if (sVar9 == 2) {
                  BVar21 = DiffuseBxDF::Flags(pDVar29);
                }
                else {
                  fVar41 = (pDVar29->R).values.values[0];
                  BVar21 = DiffuseReflection;
                  if ((fVar41 == 0.0) && (!NAN(fVar41))) {
                    uVar23 = 0xffffffffffffffff;
                    while (uVar23 != 2) {
                      fVar41 = (pDVar29->R).values.values[uVar23 + 2];
                      uVar23 = uVar23 + 1;
                      if ((fVar41 != 0.0) || (NAN(fVar41))) goto LAB_003f10e6;
                    }
                    uVar23 = 3;
LAB_003f10e6:
                    BVar21 = (uint)(uVar23 < 3) * 5;
                  }
                }
              }
              else {
                pLVar30 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                          ((ulong)bsdf.bxdf.
                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                  .bits & 0xffffffffffff);
                if (sVar9 == 4) {
                  BVar21 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                     (pLVar30);
                }
                else if (sVar9 == 3) {
                  BVar21 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                                     ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                       *)pLVar30);
                }
                else {
                  vminss_avx(ZEXT416((uint)(pLVar30->top).mfDistrib.alpha_y),
                             ZEXT416((uint)(pLVar30->top).mfDistrib.alpha_x));
                  BVar21 = GlossyTransmission|Reflection;
                }
              }
            }
            else if ((ulong)bsdf.bxdf.
                            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                            .bits < 0x8000000000000) {
              BVar21 = SpecularTransmission|Reflection;
              if (sVar9 == 7) {
                BVar21 = GlossyReflection;
              }
            }
            else if ((ulong)bsdf.bxdf.
                            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                            .bits >> 0x30 == 8) {
              BVar21 = GlossyReflection;
            }
            else if (sVar9 == 9) {
              vminss_avx(ZEXT416(((uint *)((ulong)bsdf.bxdf.
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                                  .bits & 0xffffffffffff))[1]),
                         ZEXT416(*(uint *)((ulong)bsdf.bxdf.
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                                  .bits & 0xffffffffffff)));
              BVar21 = GlossyReflection;
            }
            else {
              BVar21 = DiffuseReflection;
            }
            if ((BVar21 & Reflection) == Unset) {
LAB_003f125d:
              uVar23 = (sampler->
                       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
              pDVar27 = (DebugMLTSampler *)(uVar23 & 0xffffffffffff);
              sVar9 = (short)(uVar23 >> 0x30);
              if (uVar23 < 0x5000000000000) {
                if (uVar23 < 0x3000000000000) {
                  if (sVar9 == 2) {
                    auVar65._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar27);
                    auVar65._8_56_ = extraout_var_11;
                    local_2f8 = auVar65._0_16_;
                  }
                  else {
                    auVar71._0_8_ = RandomSampler::Get2D((RandomSampler *)pDVar27);
                    auVar71._8_56_ = extraout_var_17;
                    local_2f8 = auVar71._0_16_;
                  }
                }
                else if (sVar9 == 3) {
                  auVar68._0_8_ = HaltonSampler::Get2D((HaltonSampler *)pDVar27);
                  auVar68._8_56_ = extraout_var_14;
                  local_2f8 = auVar68._0_16_;
                }
                else {
                  auVar73._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar27);
                  auVar73._8_56_ = extraout_var_19;
                  local_2f8 = auVar73._0_16_;
                }
              }
              else if (uVar23 < 0x7000000000000) {
                if (sVar9 == 6) {
                  auVar66._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)pDVar27);
                  auVar66._8_56_ = extraout_var_12;
                  local_2f8 = auVar66._0_16_;
                }
                else {
                  auVar72._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar27);
                  auVar72._8_56_ = extraout_var_18;
                  local_2f8 = auVar72._0_16_;
                }
              }
              else if (uVar23 >> 0x30 == 8) {
                auVar74._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar27);
                auVar74._8_56_ = extraout_var_20;
                local_2f8 = auVar74._0_16_;
              }
              else if (sVar9 == 7) {
                auVar69._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar27);
                auVar69._8_56_ = extraout_var_15;
                local_2f8 = auVar69._0_16_;
              }
              else {
                local_368._0_4_ = DebugMLTSampler::Get1D(pDVar27);
                local_368._4_4_ = extraout_XMM0_Db_01;
                uStack_360 = extraout_XMM0_Dc_01;
                uStack_35c = extraout_XMM0_Dd_01;
                auVar75._0_4_ = DebugMLTSampler::Get1D(pDVar27);
                auVar75._4_60_ = extraout_var_01;
                local_2f8 = vinsertps_avx(_local_368,auVar75._0_16_,0x10);
              }
              fVar41 = local_2f8._0_4_;
              auVar87._0_12_ = ZEXT812(0);
              auVar87._12_4_ = 0;
              auVar35 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar41 * fVar41)),auVar87);
              if (auVar35._0_4_ < 0.0) {
                fVar38 = sqrtf(auVar35._0_4_);
              }
              else {
                auVar35 = vsqrtss_avx(auVar35,auVar35);
                fVar38 = auVar35._0_4_;
              }
              auVar35 = vmovshdup_avx(local_2f8);
              fVar40 = auVar35._0_4_ * 6.2831855;
              fVar39 = cosf(fVar40);
              local_318 = ZEXT416((uint)(fVar39 * fVar38));
              fVar40 = sinf(fVar40);
              auVar35 = vinsertps_avx(local_318,ZEXT416((uint)(fVar40 * fVar38)),0x10);
              uVar2 = vmovlps_avx(auVar35);
              f.values.values[0] = (float)uVar2;
              f.values.values[1] = (float)((ulong)uVar2 >> 0x20);
              sVar9 = bsdf.bxdf.
                      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                      .bits._6_2_;
              f.values.values[2] = fVar41;
              if ((ulong)bsdf.bxdf.
                         super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                         .bits < 0x6000000000000) {
                if ((ulong)bsdf.bxdf.
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                           .bits < 0x3000000000000) {
                  pDVar29 = (DiffuseBxDF *)
                            ((ulong)bsdf.bxdf.
                                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                    .bits & 0xffffffffffff);
                  if (sVar9 == 2) {
                    BVar21 = DiffuseBxDF::Flags(pDVar29);
                  }
                  else {
                    fVar41 = (pDVar29->R).values.values[0];
                    BVar21 = DiffuseReflection;
                    if ((fVar41 == 0.0) && (!NAN(fVar41))) {
                      uVar23 = 0xffffffffffffffff;
                      while (uVar23 != 2) {
                        fVar41 = (pDVar29->R).values.values[uVar23 + 2];
                        uVar23 = uVar23 + 1;
                        if ((fVar41 != 0.0) || (NAN(fVar41))) goto LAB_003f16fc;
                      }
                      uVar23 = 3;
LAB_003f16fc:
                      BVar21 = (uint)(uVar23 < 3) * 5;
                    }
                  }
                }
                else {
                  pLVar30 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                            ((ulong)bsdf.bxdf.
                                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                    .bits & 0xffffffffffff);
                  if (sVar9 == 4) {
                    BVar21 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                       (pLVar30);
                  }
                  else if (sVar9 == 3) {
                    BVar21 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                             Flags((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                    *)pLVar30);
                  }
                  else {
                    vminss_avx(ZEXT416((uint)(pLVar30->top).mfDistrib.alpha_y),
                               ZEXT416((uint)(pLVar30->top).mfDistrib.alpha_x));
                    BVar21 = GlossyTransmission|Reflection;
                  }
                }
              }
              else if ((ulong)bsdf.bxdf.
                              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                              .bits < 0x8000000000000) {
                BVar21 = SpecularTransmission|Reflection;
                if (sVar9 == 7) {
                  BVar21 = GlossyReflection;
                }
              }
              else if ((ulong)bsdf.bxdf.
                              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                              .bits >> 0x30 == 8) {
                BVar21 = GlossyReflection;
              }
              else if (sVar9 == 9) {
                vminss_avx(ZEXT416(((uint *)((ulong)bsdf.bxdf.
                                                                                                        
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                                  .bits & 0xffffffffffff))[1]),
                           ZEXT416(*(uint *)((ulong)bsdf.bxdf.
                                                                                                        
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                                  .bits & 0xffffffffffff)));
                BVar21 = GlossyReflection;
              }
              else {
                BVar21 = DiffuseReflection;
              }
              if ((BVar21 & Reflection) == Unset) {
LAB_003f1791:
                sVar9 = bsdf.bxdf.
                        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                        .bits._6_2_;
                if ((ulong)bsdf.bxdf.
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                           .bits < 0x6000000000000) {
                  if ((ulong)bsdf.bxdf.
                             super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                             .bits < 0x3000000000000) {
                    pDVar29 = (DiffuseBxDF *)
                              ((ulong)bsdf.bxdf.
                                      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                      .bits & 0xffffffffffff);
                    if (sVar9 == 2) {
                      BVar21 = DiffuseBxDF::Flags(pDVar29);
                    }
                    else {
                      fVar41 = (pDVar29->R).values.values[0];
                      BVar21 = Unset;
                      if ((fVar41 == 0.0) && (!NAN(fVar41))) {
                        uVar23 = 0xffffffffffffffff;
                        while (uVar23 != 2) {
                          fVar41 = (pDVar29->R).values.values[uVar23 + 2];
                          uVar23 = uVar23 + 1;
                          if ((fVar41 != 0.0) || (NAN(fVar41))) goto LAB_003f18e4;
                        }
                        uVar23 = 3;
LAB_003f18e4:
                        BVar21 = (uint)(uVar23 < 3) * 5;
                      }
                    }
                  }
                  else {
                    pLVar30 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                              ((ulong)bsdf.bxdf.
                                      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                      .bits & 0xffffffffffff);
                    if (sVar9 == 4) {
                      BVar21 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                               Flags(pLVar30);
                    }
                    else if (sVar9 == 3) {
                      BVar21 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                               Flags((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                      *)pLVar30);
                    }
                    else {
                      vminss_avx(ZEXT416((uint)(pLVar30->top).mfDistrib.alpha_y),
                                 ZEXT416((uint)(pLVar30->top).mfDistrib.alpha_x));
                      BVar21 = GlossyTransmission|Reflection;
                    }
                  }
                }
                else if ((ulong)bsdf.bxdf.
                                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                .bits < 0x8000000000000) {
                  BVar21 = SpecularTransmission|Reflection;
                  if (sVar9 == 7) {
                    BVar21 = Unset;
                  }
                }
                else if ((ulong)bsdf.bxdf.
                                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                .bits >> 0x30 == 8) {
                  BVar21 = Unset;
                }
                else if (sVar9 == 9) {
                  vminss_avx(ZEXT416(((uint *)((ulong)bsdf.bxdf.
                                                                                                            
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                                  .bits & 0xffffffffffff))[1]),
                             ZEXT416(*(uint *)((ulong)bsdf.bxdf.
                                                                                                            
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                                  .bits & 0xffffffffffff)));
                  BVar21 = Unset;
                }
                else {
                  BVar21 = Unset;
                }
                auVar35 = SUB6416(ZEXT464(0x3e22f983),0);
                if ((BVar21 & Transmission) != Unset) {
                  auVar11._8_4_ = 0x80000000;
                  auVar11._0_8_ = uVar18 ^ 0x8000000080000000;
                  auVar11._12_4_ = 0x80000000;
                  auVar34 = vmovshdup_avx(auVar11);
                  auVar34 = vfmadd213ss_fma(auVar34,ZEXT416((uint)si.optionalValue._44_4_),
                                            ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                          auVar43._0_4_)));
                  auVar35 = vfmsub213ss_fma(auVar43,ZEXT416((uint)si.optionalValue._48_4_),
                                            ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                          auVar43._0_4_)));
                  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ + auVar35._0_4_)),
                                            ZEXT416((uint)si.optionalValue._40_4_),auVar11);
                  auVar46._4_4_ = f.values.values[1];
                  auVar46._0_4_ = f.values.values[0];
                  auVar46._8_8_ = 0;
                  auVar34 = vmovshdup_avx(auVar46);
                  auVar34 = vfmadd213ss_fma(auVar34,ZEXT416((uint)si.optionalValue._44_4_),
                                            ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                          f.values.values[2])));
                  auVar35 = vfmsub213ss_fma(ZEXT416((uint)si.optionalValue._48_4_),
                                            ZEXT416((uint)f.values.values[2]),
                                            ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                          f.values.values[2])));
                  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ + auVar35._0_4_)),auVar46,
                                            ZEXT416((uint)si.optionalValue._40_4_));
                  auVar35 = SUB6416(ZEXT464(0x3e22f983),0);
                  if (0.0 < auVar42._0_4_ * auVar36._0_4_) goto LAB_003f1985;
                }
              }
              else {
                auVar10._8_4_ = 0x80000000;
                auVar10._0_8_ = uVar17 ^ 0x8000000080000000;
                auVar10._12_4_ = 0x80000000;
                auVar34 = vmovshdup_avx(auVar10);
                auVar34 = vfmadd213ss_fma(auVar34,ZEXT416((uint)si.optionalValue._44_4_),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        auVar43._0_4_)));
                auVar35 = vfmsub231ss_fma(ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        auVar43._0_4_)),
                                          ZEXT416((uint)si.optionalValue._48_4_),auVar43);
                auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ + auVar35._0_4_)),
                                          ZEXT416((uint)si.optionalValue._40_4_),auVar10);
                auVar46._4_4_ = f.values.values[1];
                auVar46._0_4_ = f.values.values[0];
                auVar46._8_8_ = 0;
                auVar34 = vmovshdup_avx(auVar46);
                auVar34 = vfmadd213ss_fma(auVar34,ZEXT416((uint)si.optionalValue._44_4_),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        f.values.values[2])));
                auVar42 = vfmsub213ss_fma(ZEXT416((uint)si.optionalValue._48_4_),
                                          ZEXT416((uint)f.values.values[2]),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        f.values.values[2])));
                auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ + auVar42._0_4_)),auVar46,
                                          ZEXT416((uint)si.optionalValue._40_4_));
                if (0.0 <= auVar35._0_4_ * auVar42._0_4_) goto LAB_003f1791;
LAB_003f1985:
                auVar47._0_8_ = auVar46._0_8_ ^ 0x8000000080000000;
                auVar47._8_4_ = auVar46._8_4_ ^ 0x80000000;
                auVar47._12_4_ = auVar46._12_4_ ^ 0x80000000;
                f.values.values[2] = -f.values.values[2];
                uVar2 = vmovlps_avx(auVar47);
                f.values.values[0] = (float)uVar2;
                f.values.values[1] = (float)((ulong)uVar2 >> 0x20);
                auVar35 = SUB6416(ZEXT464(0x3e22f983),0);
              }
            }
            else {
              sVar9 = bsdf.bxdf.
                      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                      .bits._6_2_;
              if ((ulong)bsdf.bxdf.
                         super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                         .bits < 0x6000000000000) {
                if ((ulong)bsdf.bxdf.
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                           .bits < 0x3000000000000) {
                  pDVar29 = (DiffuseBxDF *)
                            ((ulong)bsdf.bxdf.
                                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                    .bits & 0xffffffffffff);
                  if (sVar9 == 2) {
                    BVar21 = DiffuseBxDF::Flags(pDVar29);
                  }
                  else {
                    fVar41 = (pDVar29->R).values.values[0];
                    BVar21 = Unset;
                    if ((fVar41 == 0.0) && (!NAN(fVar41))) {
                      uVar23 = 0xffffffffffffffff;
                      while (uVar23 != 2) {
                        fVar41 = (pDVar29->R).values.values[uVar23 + 2];
                        uVar23 = uVar23 + 1;
                        if ((fVar41 != 0.0) || (NAN(fVar41))) goto LAB_003f124d;
                      }
                      uVar23 = 3;
LAB_003f124d:
                      BVar21 = (uint)(uVar23 < 3) * 5;
                    }
                  }
                }
                else {
                  pLVar30 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                            ((ulong)bsdf.bxdf.
                                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                    .bits & 0xffffffffffff);
                  if (sVar9 == 4) {
                    BVar21 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                       (pLVar30);
                  }
                  else if (sVar9 == 3) {
                    BVar21 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                             Flags((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                    *)pLVar30);
                  }
                  else {
                    vminss_avx(ZEXT416((uint)(pLVar30->top).mfDistrib.alpha_y),
                               ZEXT416((uint)(pLVar30->top).mfDistrib.alpha_x));
                    BVar21 = GlossyTransmission|Reflection;
                  }
                }
              }
              else if ((ulong)bsdf.bxdf.
                              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                              .bits < 0x8000000000000) {
                BVar21 = SpecularTransmission|Reflection;
                if (sVar9 == 7) {
                  BVar21 = Unset;
                }
              }
              else if ((ulong)bsdf.bxdf.
                              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                              .bits >> 0x30 == 8) {
                BVar21 = Unset;
              }
              else if (sVar9 == 9) {
                vminss_avx(ZEXT416(((uint *)((ulong)bsdf.bxdf.
                                                                                                        
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                                  .bits & 0xffffffffffff))[1]),
                           ZEXT416(*(uint *)((ulong)bsdf.bxdf.
                                                                                                        
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                                  .bits & 0xffffffffffff)));
                BVar21 = Unset;
              }
              else {
                BVar21 = Unset;
              }
              if ((BVar21 & Transmission) == Unset) goto LAB_003f125d;
              uVar23 = (sampler->
                       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
              pDVar27 = (DebugMLTSampler *)(uVar23 & 0xffffffffffff);
              sVar9 = (short)(uVar23 >> 0x30);
              if (uVar23 < 0x5000000000000) {
                if (uVar23 < 0x3000000000000) {
                  if (sVar9 == 2) {
                    auVar67._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar27);
                    auVar67._8_56_ = extraout_var_13;
                    auVar35 = auVar67._0_16_;
                  }
                  else {
                    auVar78._0_8_ = RandomSampler::Get2D((RandomSampler *)pDVar27);
                    auVar78._8_56_ = extraout_var_23;
                    auVar35 = auVar78._0_16_;
                  }
                }
                else if (sVar9 == 3) {
                  auVar76._0_8_ = HaltonSampler::Get2D((HaltonSampler *)pDVar27);
                  auVar76._8_56_ = extraout_var_21;
                  auVar35 = auVar76._0_16_;
                }
                else {
                  auVar80._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar27);
                  auVar80._8_56_ = extraout_var_25;
                  auVar35 = auVar80._0_16_;
                }
              }
              else if (uVar23 < 0x7000000000000) {
                if (sVar9 == 6) {
                  auVar70._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)pDVar27);
                  auVar70._8_56_ = extraout_var_16;
                  auVar35 = auVar70._0_16_;
                }
                else {
                  auVar79._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar27);
                  auVar79._8_56_ = extraout_var_24;
                  auVar35 = auVar79._0_16_;
                }
              }
              else if (uVar23 >> 0x30 == 8) {
                auVar81._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar27);
                auVar81._8_56_ = extraout_var_26;
                auVar35 = auVar81._0_16_;
              }
              else if (sVar9 == 7) {
                auVar77._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar27);
                auVar77._8_56_ = extraout_var_22;
                auVar35 = auVar77._0_16_;
              }
              else {
                local_368._0_4_ = DebugMLTSampler::Get1D(pDVar27);
                local_368._4_4_ = extraout_XMM0_Db_02;
                uStack_360 = extraout_XMM0_Dc_02;
                uStack_35c = extraout_XMM0_Dd_02;
                auVar82._0_4_ = DebugMLTSampler::Get1D(pDVar27);
                auVar82._4_60_ = extraout_var_02;
                auVar35 = vinsertps_avx(_local_368,auVar82._0_16_,0x10);
              }
              local_2f8 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar35,ZEXT416(0xc0000000)
                                         );
              auVar42 = vfnmadd213ss_fma(local_2f8,local_2f8,SUB6416(ZEXT464(0x3f800000),0));
              auVar42 = vmaxss_avx(auVar42,ZEXT816(0));
              if (auVar42._0_4_ < 0.0) {
                local_318 = auVar35;
                fVar41 = sqrtf(auVar42._0_4_);
                auVar35 = local_318;
              }
              else {
                auVar42 = vsqrtss_avx(auVar42,auVar42);
                fVar41 = auVar42._0_4_;
              }
              auVar35 = vmovshdup_avx(auVar35);
              fVar38 = auVar35._0_4_ * 6.2831855;
              fVar40 = cosf(fVar38);
              local_318 = ZEXT416((uint)(fVar40 * fVar41));
              fVar38 = sinf(fVar38);
              auVar35 = vinsertps_avx(local_318,ZEXT416((uint)(fVar38 * fVar41)),0x10);
              uVar2 = vmovlps_avx(auVar35);
              f.values.values[0] = (float)uVar2;
              f.values.values[1] = (float)((ulong)uVar2 >> 0x20);
              auVar35 = SUB6416(ZEXT464(0x3da2f983),0);
              f.values.values[2] = (float)local_2f8._0_4_;
            }
            wiRender.super_Tuple3<pbrt::Vector3,_float>.y = f.values.values[1];
            wiRender.super_Tuple3<pbrt::Vector3,_float>.x = f.values.values[0];
            wiRender.super_Tuple3<pbrt::Vector3,_float>.z = f.values.values[2];
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.z = auVar43._0_4_;
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.x =
                 (float)(int)(uVar19 ^ 0x8000000080000000);
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.y =
                 (float)(int)((uVar19 ^ 0x8000000080000000) >> 0x20);
            auVar97 = ZEXT856(uStack_2c0);
            auVar84 = ZEXT856(0x8000000080000000);
            SVar99 = BSDF::f(&bsdf,woRender_01,wiRender,Radiance);
            auVar96._0_8_ = SVar99.values.values._8_8_;
            auVar96._8_56_ = auVar97;
            auVar83._0_8_ = SVar99.values.values._0_8_;
            auVar83._8_56_ = auVar84;
            auVar42 = vmovlhps_avx(auVar83._0_16_,auVar96._0_16_);
            auVar36 = vfmadd132ss_fma(ZEXT416((uint)si.optionalValue._132_4_),
                                      ZEXT416((uint)((float)si.optionalValue._136_4_ *
                                                    f.values.values[2])),
                                      ZEXT416((uint)f.values.values[1]));
            auVar43 = vfmsub213ss_fma(ZEXT416((uint)f.values.values[2]),
                                      ZEXT416((uint)si.optionalValue._136_4_),
                                      ZEXT416((uint)((float)si.optionalValue._136_4_ *
                                                    f.values.values[2])));
            auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ + auVar43._0_4_)),
                                      ZEXT416((uint)si.optionalValue._128_4_),
                                      ZEXT416((uint)f.values.values[0]));
            auVar88._0_4_ = auVar36._0_4_;
            auVar88._4_4_ = auVar88._0_4_;
            auVar88._8_4_ = auVar88._0_4_;
            auVar88._12_4_ = auVar88._0_4_;
            auVar7._8_4_ = 0x7fffffff;
            auVar7._0_8_ = 0x7fffffff7fffffff;
            auVar7._12_4_ = 0x7fffffff;
            auVar36 = vandps_avx512vl(auVar88,auVar7);
            auVar48._0_4_ = auVar36._0_4_ * auVar42._0_4_;
            auVar48._4_4_ = auVar36._4_4_ * auVar42._4_4_;
            auVar48._8_4_ = auVar36._8_4_ * auVar42._8_4_;
            auVar48._12_4_ = auVar36._12_4_ * auVar42._12_4_;
            local_368._0_4_ = auVar35._0_4_;
            auVar89._4_4_ = local_368._0_4_;
            auVar89._0_4_ = local_368._0_4_;
            auVar89._8_4_ = local_368._0_4_;
            auVar89._12_4_ = local_368._0_4_;
            auVar42 = vdivps_avx(auVar48,auVar89);
            beta.values.values[0] = auVar42._0_4_ * beta.values.values[0];
            beta.values.values[1] = auVar42._4_4_ * beta.values.values[1];
            beta.values.values[2] = auVar42._8_4_ * beta.values.values[2];
            beta.values.values[3] = auVar42._12_4_ * beta.values.values[3];
            Interaction::SpawnRay((RayDifferential *)&ls,(Interaction *)&si,(Vector3f *)&f);
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)ls.optionalValue._12_4_
            ;
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)ls.optionalValue._16_4_
            ;
            *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                 CONCAT44(ls.optionalValue._24_4_,ls.optionalValue._20_4_);
            *(anon_struct_8_0_00000001_for___align *)
             &(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float> = ls.optionalValue.__align;
            *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                 CONCAT44(ls.optionalValue._12_4_,ls.optionalValue._8_4_);
            (ray->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = ls.optionalValue._32_8_;
            auVar13._4_8_ = ls.optionalValue._64_8_;
            auVar13._0_4_ = ls.optionalValue._60_4_;
            auVar13._12_20_ = ls.optionalValue._72_20_;
            *(undefined1 (*) [32])&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = auVar13;
            ray->hasDifferentials = (bool)ls.optionalValue._40_1_;
            *(undefined3 *)&ray->field_0x29 = ls.optionalValue._41_3_;
            (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)ls.optionalValue._44_4_;
            (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)ls.optionalValue._48_4_;
            (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = (float)ls.optionalValue._52_4_;
            (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)ls.optionalValue._56_4_;
            (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)ls.optionalValue._60_4_;
            *(undefined8 *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
                 ls.optionalValue._64_8_;
            stack0xfffffffffffffc9c = auVar35._4_12_;
            auVar15._12_4_ = 0;
            auVar15._0_12_ = stack0xfffffffffffffc9c;
            _local_368 = auVar15 << 0x20;
          }
          in_ZMM6 = ZEXT1664(auVar34);
          FVar37 = SampledSpectrum::y(&beta,lambda);
          ls.optionalValue._0_4_ = FVar37;
          f.values.values[0] = 0.0;
          if (FVar37 < 0.0) {
            LogFatal<char_const(&)[15],char_const(&)[4],char_const(&)[15],float&,char_const(&)[4],float&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                       ,0x1e4,"Check failed: %s >= %s with %s = %s, %s = %s",
                       (char (*) [15])"beta.y(lambda)",(char (*) [4])"0.f",
                       (char (*) [15])"beta.y(lambda)",(float *)&ls,(char (*) [4])"0.f",(float *)&f)
            ;
          }
          iVar20 = 0;
        }
LAB_003f1ae3:
        bVar33 = iVar20 == 3;
      }
    }
    if (si.set == true) {
      si._256_8_ = si._256_8_ & 0xffffffffffffff00;
    }
  } while (!bVar33);
  auVar34 = vshufpd_avx(_local_2e8,_local_2e8,1);
  SVar100.values.values._0_8_ = local_2e8;
  SVar100.values.values._8_8_ = auVar34._0_8_;
  return (SampledSpectrum)SVar100.values.values;
}

Assistant:

SampledSpectrum SimplePathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                         SamplerHandle sampler,
                                         ScratchBuffer &scratchBuffer,
                                         VisibleSurface *) const {
    // Estimate radiance along ray using simple path tracing
    SampledSpectrum L(0.f), beta(1.f);
    bool specularBounce = true;
    int depth = 0;
    while (beta) {
        // Find next _SimplePathIntegrator_ path vertex and accumulate contribution
        // Intersect _ray_ with scene
        pstd::optional<ShapeIntersection> si = Intersect(ray);

        // Account for infinite lights if ray has no intersection
        if (!si) {
            if (!sampleLights || specularBounce)
                for (const auto &light : infiniteLights)
                    L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
            break;
        }

        // Account for emsisive surface if light wasn't sampled
        SurfaceInteraction &isect = si->intr;
        if (!sampleLights || specularBounce)
            L += SafeDiv(beta * isect.Le(-ray.d, lambda), lambda.PDF());

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Sample direct illumination if _sampleLights_ is true
        Vector3f wo = -ray.d;
        if (sampleLights) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());
            if (sampledLight) {
                // Sample point on _sampledLight_ to estimate direct illumination
                Point2f uLight = sampler.Get2D();
                pstd::optional<LightLiSample> ls =
                    sampledLight->light.SampleLi(isect, uLight, lambda);
                if (ls && ls->L && ls->pdf > 0) {
                    // Evaluate BSDF for light and possibly add scattered radiance
                    Vector3f wi = ls->wi;
                    SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n);
                    if (f && Unoccluded(isect, ls->pLight))
                        L += SafeDiv(beta * f * ls->L,
                                     sampledLight->pdf * ls->pdf * lambda.PDF());
                }
            }
        }

        // Sample outoing direction at intersection to continue path
        if (sampleBSDF) {
            // Sample BSDF for new path direction
            Float u = sampler.Get1D();
            pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D());
            if (!bs)
                break;
            beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
            specularBounce = bs->IsSpecular();
            ray = isect.SpawnRay(bs->wi);

        } else {
            // Uniformly sample sphere or hemisphere to get new path direction
            Float pdf;
            Vector3f wi;
            if (bsdf.HasReflection() && bsdf.HasTransmission()) {
                wi = SampleUniformSphere(sampler.Get2D());
                pdf = UniformSpherePDF();
            } else {
                wi = SampleUniformHemisphere(sampler.Get2D());
                pdf = UniformHemispherePDF();
                if (bsdf.HasReflection() && Dot(wo, isect.n) * Dot(wi, isect.n) < 0)
                    wi = -wi;
                else if (bsdf.HasTransmission() &&
                         Dot(wo, isect.n) * Dot(wi, isect.n) > 0)
                    wi = -wi;
            }
            beta *= bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n) / pdf;
            specularBounce = false;
            ray = isect.SpawnRay(wi);
        }

        CHECK_GE(beta.y(lambda), 0.f);
        DCHECK(!IsInf(beta.y(lambda)));
    }
    return L;
}